

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::api::json::DecodeRawTransactionRequest::ConvertFromStruct
          (DecodeRawTransactionRequest *this,DecodeRawTransactionRequestStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->hex_);
  std::__cxx11::string::_M_assign((string *)&this->network_);
  this->iswitness_ = data->iswitness;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DecodeRawTransactionRequest::ConvertFromStruct(
    const DecodeRawTransactionRequestStruct& data) {
  hex_ = data.hex;
  network_ = data.network;
  iswitness_ = data.iswitness;
  ignore_items = data.ignore_items;
}